

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

DroppedFieldMapping *
duckdb::RenameFieldFromStruct
          (DroppedFieldMapping *__return_storage_ptr__,LogicalType *type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_path,string *new_name,idx_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  DroppedFieldMapping *pDVar10;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  CatalogException *pCVar11;
  const_reference pvVar12;
  pointer l2;
  pointer name;
  DroppedFieldMapping *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_name;
  child_list_t<Value> child_values;
  child_list_t<LogicalType> new_type_children;
  child_list_t<Value> child_mapping;
  Value mapping_value;
  LogicalType local_408;
  ulong local_3f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_3e8;
  DroppedFieldMapping *local_3e0;
  string local_3d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_3b8;
  pointer local_398;
  pointer ppStack_390;
  pointer local_388;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_378;
  idx_t local_360;
  idx_t local_358;
  const_reference local_350;
  Value local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_2d8;
  LogicalType *local_2d0;
  child_list_t<LogicalType> *local_2c8;
  pointer local_2c0;
  string local_2b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_298;
  Value local_280;
  undefined1 local_240 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e0 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  child_list_t<LogicalType> local_168;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b8;
  undefined1 local_b0 [32];
  undefined1 local_90 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_80 [56];
  LogicalType local_48;
  
  local_3e0 = __return_storage_ptr__;
  if (type->id_ != STRUCT) {
    pCVar11 = (CatalogException *)__cxa_allocate_exception(0x10);
    local_280.type_._0_8_ = (long)&local_280 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"Cannot rename field from column \"%s\" - not a struct","");
    pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](column_path,0);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    pcVar2 = (pvVar12->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar2,pcVar2 + pvVar12->_M_string_length);
    CatalogException::CatalogException<std::__cxx11::string>(pCVar11,(string *)&local_280,&local_e8)
    ;
    __cxa_throw(pCVar11,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_350 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](column_path,depth);
  local_358 = (long)(column_path->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(column_path->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  LogicalType::LogicalType((LogicalType *)local_c8,SQLNULL);
  Value::Value(&local_280,(LogicalType *)local_c8);
  LogicalType::~LogicalType((LogicalType *)local_c8);
  LogicalType::LogicalType((LogicalType *)local_240);
  ErrorData::ErrorData((ErrorData *)(local_240 + 0x18));
  __return_storage_ptr___00 = local_3e0;
  local_378.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388 = (pointer)0x0;
  local_398 = (pointer)0x0;
  ppStack_390 = (pointer)0x0;
  local_360 = depth;
  local_2c8 = StructType::GetChildTypes_abi_cxx11_(type);
  name = (local_2c8->
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         ).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_2c0 = (local_2c8->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (name != local_2c0) {
    local_360 = local_360 + 1;
    local_358 = (long)local_358 >> 5;
    local_2d0 = &__return_storage_ptr___00->new_type;
    local_2d8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&(__return_storage_ptr___00->error).extra_info;
    local_2e0 = &(__return_storage_ptr___00->error).final_message.field_2;
    local_2e8 = &(__return_storage_ptr___00->error).raw_message.field_2;
    local_3f0 = 0;
    local_3e8 = column_path;
    do {
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      pcVar2 = (name->first)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d8,pcVar2,pcVar2 + (name->first)._M_string_length);
      LogicalType::LogicalType(&local_48,SQLNULL);
      Value::Value((Value *)local_c8,&local_48);
      LogicalType::~LogicalType(&local_48);
      LogicalType::LogicalType(&local_408);
      bVar9 = StringUtil::CIEquals(&local_3d8,local_350);
      if (bVar9) {
        if (local_360 == local_358) {
          ppVar3 = (local_2c8->
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   ).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (l2 = (local_2c8->
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; l2 != ppVar3; l2 = l2 + 1) {
            bVar9 = StringUtil::CIEquals(new_name,&l2->first);
            if (bVar9) {
              pCVar11 = (CatalogException *)__cxa_allocate_exception(0x10);
              local_348.type_._0_8_ =
                   &local_348.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_348,
                         "Cannot rename field %s from column %s to %s - a field with this name already exists"
                         ,"");
              pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::back(local_3e8);
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
              pcVar2 = (pvVar12->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_108,pcVar2,pcVar2 + pvVar12->_M_string_length);
              pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::front(local_3e8);
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              pcVar2 = (pvVar12->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,pcVar2,pcVar2 + pvVar12->_M_string_length);
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              pcVar2 = (new_name->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_188,pcVar2,pcVar2 + new_name->_M_string_length);
              CatalogException::
              CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (pCVar11,(string *)&local_348,&local_108,&local_128,&local_188);
              __cxa_throw(pCVar11,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          ::std::__cxx11::string::_M_assign((string *)&local_3d8);
          __return_storage_ptr___00 = local_3e0;
          ConstructMapping(&local_348,&name->first,&name->second);
          Value::operator=((Value *)local_c8,&local_348);
          Value::~Value(&local_348);
          local_3f0 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          goto LAB_00a8cf8e;
        }
        pDVar10 = RenameFieldFromStruct
                            (__return_storage_ptr___00,&name->second,local_3e8,new_name,local_360);
        if ((__return_storage_ptr___00->error).initialized == false) {
          Value::operator=((Value *)local_c8,&__return_storage_ptr___00->mapping);
          local_408.id_ = (__return_storage_ptr___00->new_type).id_;
          local_408.physical_type_ = (__return_storage_ptr___00->new_type).physical_type_;
          peVar4 = (__return_storage_ptr___00->new_type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var5 = (__return_storage_ptr___00->new_type).type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          (__return_storage_ptr___00->new_type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_408.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (__return_storage_ptr___00->new_type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_408.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          local_408.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
          local_408.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               p_Var5;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(local_2d8);
          pcVar2 = (__return_storage_ptr___00->error).final_message._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 != local_2e0) {
            operator_delete(pcVar2);
          }
          pcVar2 = (__return_storage_ptr___00->error).raw_message._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 != local_2e8) {
            operator_delete(pcVar2);
          }
          LogicalType::~LogicalType(local_2d0);
          Value::~Value(&__return_storage_ptr___00->mapping);
          local_3f0 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
          goto LAB_00a8d03f;
        }
        local_3f0 = CONCAT71((int7)((ulong)pDVar10 >> 8),1);
        bVar9 = false;
      }
      else {
        ConstructMapping(&local_348,&name->first,&name->second);
        Value::operator=((Value *)local_c8,&local_348);
        Value::~Value(&local_348);
LAB_00a8cf8e:
        if (&local_408 != &name->second) {
          local_408.id_ = (name->second).id_;
          local_408.physical_type_ = (name->second).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&local_408.type_info_,&(name->second).type_info_);
        }
LAB_00a8d03f:
        if ((name->second).id_ == STRUCT) {
          local_3b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          local_308._M_string_length = 0;
          local_308.field_2._M_local_buf[0] = '\0';
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          pcVar2 = (name->first)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b8,pcVar2,pcVar2 + (name->first)._M_string_length);
          Value::Value(&local_348,&local_2b8);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                      *)&local_3b8,&local_308,&local_348);
          Value::~Value(&local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          pp_Var6 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                    &local_348.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          local_348.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_348.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_1_ = '\0';
          local_348.type_._0_8_ = pp_Var6;
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                      *)&local_3b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348
                     ,(Value *)local_c8);
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_348.type_._0_8_ != pp_Var6) {
            operator_delete((void *)local_348.type_._0_8_);
          }
          local_298.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_3b8.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_298.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_3b8.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_298.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_3b8.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_3b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3b8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Value::STRUCT(&local_348,(child_list_t<Value> *)&local_298);
          Value::operator=((Value *)local_c8,&local_348);
          Value::~Value(&local_348);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ::~vector(&local_298);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ::~vector(&local_3b8);
        }
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
        ::emplace_back<std::__cxx11::string&,duckdb::Value>
                  ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                    *)&local_378,&local_3d8,(Value *)local_c8);
        bVar9 = true;
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::__cxx11::string&,duckdb::LogicalType&>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_398,&local_3d8,&local_408);
      }
      LogicalType::~LogicalType(&local_408);
      Value::~Value((Value *)local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p);
      }
      if (!bVar9) goto LAB_00a8d544;
      name = name + 1;
    } while (name != local_2c0);
    if ((local_3f0 & 1) != 0) {
      local_148.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_378.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_148.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_378.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_148.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_378.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_378.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_378.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_378.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::STRUCT((Value *)local_c8,(child_list_t<Value> *)&local_148);
      Value::operator=(&local_280,(Value *)local_c8);
      Value::~Value((Value *)local_c8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_148);
      local_168.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_398;
      local_168.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppStack_390;
      local_168.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_388;
      local_398 = (pointer)0x0;
      ppStack_390 = (pointer)0x0;
      local_388 = (pointer)0x0;
      LogicalType::STRUCT((LogicalType *)local_c8,&local_168);
      uVar8 = local_240._16_8_;
      uVar7 = local_240._8_8_;
      local_240._0_2_ = local_c8._0_2_;
      local_240._8_8_ = local_c0._M_p;
      local_240._16_8_ = _Stack_b8._M_pi;
      local_c0._M_p = (pointer)uVar7;
      _Stack_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
      LogicalType::~LogicalType((LogicalType *)local_c8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_168);
      goto LAB_00a8d443;
    }
  }
  pp_Var6 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
            &local_348.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_348.type_._0_8_ = pp_Var6;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,"Cannot rename field \"%s\" - it does not exist","");
  pcVar2 = (local_350->_M_dataplus)._M_p;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar2,pcVar2 + local_350->_M_string_length);
  CatalogException::CatalogException<std::__cxx11::string>
            ((CatalogException *)&local_3d8,(string *)&local_348,&local_1a8);
  ErrorData::ErrorData((ErrorData *)local_c8,(exception *)&local_3d8);
  local_240._24_2_ = local_c8._0_2_;
  ::std::__cxx11::string::operator=((string *)&local_220,(string *)&local_c0);
  ::std::__cxx11::string::operator=((string *)&local_200,(string *)(local_b0 + 0x10));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(local_1e0,local_80);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_80);
  if ((undefined1 *)local_b0._16_8_ != local_90) {
    operator_delete((void *)local_b0._16_8_);
  }
  if ((element_type *)local_c0._M_p != (element_type *)local_b0) {
    operator_delete(local_c0._M_p);
  }
  ::std::runtime_error::~runtime_error((runtime_error *)&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  __return_storage_ptr___00 = local_3e0;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_348.type_._0_8_ != pp_Var6) {
    operator_delete((void *)local_348.type_._0_8_);
    __return_storage_ptr___00 = local_3e0;
  }
LAB_00a8d443:
  Value::Value(&__return_storage_ptr___00->mapping,&local_280);
  LogicalType::LogicalType(&__return_storage_ptr___00->new_type,(LogicalType *)local_240);
  (__return_storage_ptr___00->error).initialized = (bool)local_240[0x18];
  (__return_storage_ptr___00->error).type = local_240[0x19];
  paVar1 = &(__return_storage_ptr___00->error).raw_message.field_2;
  (__return_storage_ptr___00->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_220 == &local_210) {
    *(undefined4 *)paVar1 = local_210._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr___00->error).raw_message.field_2 + 4) =
         local_210._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr___00->error).raw_message.field_2 + 8) =
         local_210._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr___00->error).raw_message.field_2 + 0xc) =
         local_210._12_4_;
  }
  else {
    (__return_storage_ptr___00->error).raw_message._M_dataplus._M_p = (pointer)local_220;
    (__return_storage_ptr___00->error).raw_message.field_2._M_allocated_capacity =
         CONCAT44(local_210._M_allocated_capacity._4_4_,local_210._M_allocated_capacity._0_4_);
  }
  (__return_storage_ptr___00->error).raw_message._M_string_length = local_218;
  local_218 = 0;
  local_210._M_allocated_capacity._0_4_ = local_210._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &(__return_storage_ptr___00->error).final_message.field_2;
  (__return_storage_ptr___00->error).final_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_200 == &local_1f0) {
    *(undefined4 *)paVar1 = local_1f0._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr___00->error).final_message.field_2 + 4) =
         local_1f0._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr___00->error).final_message.field_2 + 8) =
         local_1f0._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr___00->error).final_message.field_2 + 0xc) =
         local_1f0._12_4_;
  }
  else {
    (__return_storage_ptr___00->error).final_message._M_dataplus._M_p = (pointer)local_200;
    (__return_storage_ptr___00->error).final_message.field_2._M_allocated_capacity =
         CONCAT44(local_1f0._M_allocated_capacity._4_4_,local_1f0._M_allocated_capacity._0_4_);
  }
  (__return_storage_ptr___00->error).final_message._M_string_length = local_1f8;
  local_1f8 = 0;
  local_1f0._M_allocated_capacity._0_4_ = local_1f0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_220 = &local_210;
  local_200 = &local_1f0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&(__return_storage_ptr___00->error).extra_info,local_1e0,local_1e0);
LAB_00a8d544:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_398);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_378);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_1e0);
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  LogicalType::~LogicalType((LogicalType *)local_240);
  Value::~Value(&local_280);
  return __return_storage_ptr___00;
}

Assistant:

DroppedFieldMapping RenameFieldFromStruct(const LogicalType &type, const vector<string> &column_path,
                                          const string &new_name, idx_t depth) {
	if (type.id() != LogicalTypeId::STRUCT) {
		throw CatalogException("Cannot rename field from column \"%s\" - not a struct", column_path[0]);
	}
	auto &rename_entry = column_path[depth];
	bool last_entry = depth + 1 == column_path.size();
	bool found = false;
	DroppedFieldMapping result;
	child_list_t<Value> child_mapping;
	child_list_t<LogicalType> new_type_children;
	auto &child_types = StructType::GetChildTypes(type);
	for (auto &entry : child_types) {
		auto field_name = entry.first;
		Value mapping_value;
		LogicalType type_value;
		if (StringUtil::CIEquals(field_name, rename_entry)) {
			// this is the entry we are dropping
			found = true;
			if (last_entry) {
				// we are renaming this entry
				for (auto &sub_entry : child_types) {
					if (StringUtil::CIEquals(new_name, sub_entry.first)) {
						throw CatalogException(
						    "Cannot rename field %s from column %s to %s - a field with this name already exists",
						    column_path.back(), column_path.front(), new_name);
					}
				}
				field_name = new_name;
				mapping_value = ConstructMapping(entry.first, entry.second);
				type_value = entry.second;
			} else {
				// we are dropping a field in this entry - recurse
				auto child_result = RenameFieldFromStruct(entry.second, column_path, new_name, depth + 1);
				if (child_result.error.HasError()) {
					// bubble up error
					return child_result;
				}
				mapping_value = std::move(child_result.mapping);
				type_value = std::move(child_result.new_type);
			}
		} else {
			// we are not adjusting this entry - copy the type and create a straightforward mapping
			mapping_value = ConstructMapping(entry.first, entry.second);
			type_value = entry.second;
		}
		if (entry.second.id() == LogicalTypeId::STRUCT) {
			child_list_t<Value> child_values;
			child_values.emplace_back(string(), Value(entry.first));
			child_values.emplace_back(string(), std::move(mapping_value));
			mapping_value = Value::STRUCT(std::move(child_values));
		}
		child_mapping.emplace_back(field_name, std::move(mapping_value));
		new_type_children.emplace_back(field_name, type_value);
	}
	if (!found) {
		result.error = ErrorData(CatalogException("Cannot rename field \"%s\" - it does not exist", rename_entry));
	} else {
		result.mapping = Value::STRUCT(std::move(child_mapping));
		result.new_type = LogicalType::STRUCT(std::move(new_type_children));
	}
	return result;
}